

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-client.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ssize_t sVar6;
  int *piVar7;
  size_t size;
  ulong uVar8;
  FILE *pFVar9;
  char *pcVar10;
  bool bVar11;
  int sock;
  addrinfo *ai;
  pollfd local_2c8;
  undefined8 uStack_2c0;
  sockaddr_in addr;
  addrinfo local_2a8;
  termios tios;
  char buffer [512];
  
  if (argc < 2) {
    fwrite("Usage:\n ./telnet-client <host> [port]\n",0x26,1,_stderr);
  }
  else {
    if (argc == 2) {
      pcVar5 = "23";
    }
    else {
      pcVar5 = argv[2];
    }
    pcVar10 = argv[1];
    local_2a8.ai_flags = 0;
    local_2a8.ai_family = 0;
    local_2a8.ai_canonname = (char *)0x0;
    local_2a8.ai_next = (addrinfo *)0x0;
    local_2a8.ai_addrlen = 0;
    local_2a8._20_4_ = 0;
    local_2a8.ai_addr = (sockaddr *)0x0;
    local_2a8.ai_socktype = 1;
    local_2a8.ai_protocol = 0;
    iVar2 = getaddrinfo(pcVar10,pcVar5,&local_2a8,(addrinfo **)&ai);
    pFVar9 = _stderr;
    if (iVar2 == 0) {
      iVar2 = socket(2,1,0);
      pFVar9 = _stderr;
      sock = iVar2;
      if (iVar2 == -1) {
        piVar7 = __errno_location();
        pcVar5 = strerror(*piVar7);
        fprintf(pFVar9,"socket() failed: %s\n",pcVar5);
        return 1;
      }
      addr.sin_zero[0] = '\0';
      addr.sin_zero[1] = '\0';
      addr.sin_zero[2] = '\0';
      addr.sin_zero[3] = '\0';
      addr.sin_zero[4] = '\0';
      addr.sin_zero[5] = '\0';
      addr.sin_zero[6] = '\0';
      addr.sin_zero[7] = '\0';
      addr.sin_family = 2;
      addr.sin_port = 0;
      addr.sin_addr.s_addr = 0;
      iVar3 = bind(iVar2,(sockaddr *)&addr,0x10);
      pFVar9 = _stderr;
      if (iVar3 == -1) {
        piVar7 = __errno_location();
        pcVar5 = strerror(*piVar7);
        pcVar10 = "bind() failed: %s\n";
      }
      else {
        iVar3 = connect(iVar2,(sockaddr *)ai->ai_addr,ai->ai_addrlen);
        pFVar9 = _stderr;
        if (iVar3 != -1) {
          freeaddrinfo((addrinfo *)ai);
          tcgetattr(1,(termios *)&orig_tios);
          atexit(_cleanup);
          tios.c_iflag = orig_tios.c_iflag;
          tios.c_oflag = orig_tios.c_oflag;
          tios.c_cflag = orig_tios.c_cflag;
          tios.c_lflag = orig_tios.c_lflag;
          tios.c_line = orig_tios.c_line;
          tios.c_cc[0] = orig_tios.c_cc[0];
          tios.c_cc[1] = orig_tios.c_cc[1];
          tios.c_cc[2] = orig_tios.c_cc[2];
          tios.c_cc[3] = orig_tios.c_cc[3];
          tios.c_cc[4] = orig_tios.c_cc[4];
          tios.c_cc[5] = orig_tios.c_cc[5];
          tios.c_cc[6] = orig_tios.c_cc[6];
          tios.c_cc[7] = orig_tios.c_cc[7];
          tios.c_cc[8] = orig_tios.c_cc[8];
          tios.c_cc[9] = orig_tios.c_cc[9];
          tios.c_cc[10] = orig_tios.c_cc[10];
          tios.c_cc[0xb] = orig_tios.c_cc[0xb];
          tios.c_cc[0xc] = orig_tios.c_cc[0xc];
          tios.c_cc[0xd] = orig_tios.c_cc[0xd];
          tios.c_cc[0xe] = orig_tios.c_cc[0xe];
          tios.c_cc[0xf] = orig_tios.c_cc[0xf];
          tios.c_cc[0x10] = orig_tios.c_cc[0x10];
          tios.c_cc[0x11] = orig_tios.c_cc[0x11];
          tios.c_cc[0x12] = orig_tios.c_cc[0x12];
          tios.c_cc[0x13] = orig_tios.c_cc[0x13];
          tios.c_cc[0x14] = orig_tios.c_cc[0x14];
          tios.c_cc[0x15] = orig_tios.c_cc[0x15];
          tios.c_cc[0x16] = orig_tios.c_cc[0x16];
          tios.c_cc[0x17] = orig_tios.c_cc[0x17];
          tios.c_cc[0x18] = orig_tios.c_cc[0x18];
          tios.c_cc[0x19] = orig_tios.c_cc[0x19];
          tios.c_cc[0x1a] = orig_tios.c_cc[0x1a];
          tios.c_cc[0x1b] = orig_tios.c_cc[0x1b];
          tios.c_cc[0x1c] = orig_tios.c_cc[0x1c];
          tios.c_cc[0x1d] = orig_tios.c_cc[0x1d];
          tios.c_cc[0x1e] = orig_tios.c_cc[0x1e];
          tios.c_cc[0x1f] = orig_tios.c_cc[0x1f];
          tios._49_3_ = orig_tios._49_3_;
          tios.c_ispeed = orig_tios.c_ispeed;
          tios.c_ospeed = orig_tios.c_ospeed;
          cfmakeraw((termios *)&tios);
          tcsetattr(1,1,(termios *)&tios);
          do_echo = '\x01';
          telnet = telnet_init(telopts,_event_handler,'\0',&sock);
          local_2c8.fd = 0;
          local_2c8.events = 1;
          local_2c8.revents = 0;
          uStack_2c0 = (ulong)CONCAT24(1,sock);
          do {
            pcVar5 = buffer;
            iVar2 = poll(&local_2c8,2,-1);
            if (iVar2 == -1) {
LAB_001015cd:
              telnet_free(telnet);
              close(sock);
              return 0;
            }
            if (((ulong)local_2c8 & 0x19000000000000) != 0) {
              sVar6 = read(0,pcVar5,0x200);
              pFVar9 = _stderr;
              uVar4 = (uint)sVar6;
              if ((int)uVar4 < 1) {
                if (uVar4 != 0) {
                  piVar7 = __errno_location();
                  pcVar5 = strerror(*piVar7);
                  pcVar10 = "recv(server) failed: %s\n";
                  goto LAB_001016e4;
                }
                goto LAB_001015cd;
              }
              uVar8 = (ulong)(uVar4 & 0x7fffffff);
              while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
                cVar1 = *pcVar5;
                if ((cVar1 == '\r') || (cVar1 == '\n')) {
                  if (do_echo == '\x01') {
                    puts("\r");
                  }
                  size = 2;
                  pcVar10 = (char *)&_input_crlf;
                }
                else {
                  size = 1;
                  pcVar10 = pcVar5;
                  if (do_echo == '\x01') {
                    putchar((int)cVar1);
                  }
                }
                telnet_send(telnet,pcVar10,size);
                pcVar5 = pcVar5 + 1;
              }
              fflush(_stdout);
            }
            if ((uStack_2c0 & 0x19000000000000) != 0) {
              sVar6 = recv(sock,buffer,0x200,0);
              pFVar9 = _stderr;
              uVar4 = (uint)sVar6;
              if ((int)uVar4 < 1) {
                if (uVar4 != 0) {
                  piVar7 = __errno_location();
                  pcVar5 = strerror(*piVar7);
                  pcVar10 = "recv(client) failed: %s\n";
LAB_001016e4:
                  fprintf(pFVar9,pcVar10,pcVar5);
                  exit(1);
                }
                goto LAB_001015cd;
              }
              telnet_recv(telnet,buffer,(ulong)(uVar4 & 0x7fffffff));
            }
          } while( true );
        }
        piVar7 = __errno_location();
        pcVar5 = strerror(*piVar7);
        pcVar10 = "connect() failed: %s\n";
      }
      fprintf(pFVar9,pcVar10,pcVar5);
      close(iVar2);
      return 1;
    }
    pcVar5 = gai_strerror(iVar2);
    fprintf(pFVar9,"getaddrinfo() failed for %s: %s\n",pcVar10,pcVar5);
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	int rs;
	int sock;
	struct sockaddr_in addr;
	struct pollfd pfd[2];
	struct addrinfo *ai;
	struct addrinfo hints;
	struct termios tios;
	const char *servname;
	const char *hostname;

	/* check usage */
	if (argc < 2) {
		fprintf(stderr, "Usage:\n ./telnet-client <host> [port]\n");
		return 1;
	}

	/* process arguments */
	servname = (argc < 3) ? "23" : argv[2];
	hostname = argv[1];

	/* look up server host */
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	if ((rs = getaddrinfo(hostname, servname, &hints, &ai)) != 0) {
		fprintf(stderr, "getaddrinfo() failed for %s: %s\n", hostname,
				gai_strerror(rs));
		return 1;
	}
	
	/* create server socket */
	if ((sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
		fprintf(stderr, "socket() failed: %s\n", strerror(errno));
		return 1;
	}

	/* bind server socket */
	memset(&addr, 0, sizeof(addr));
	addr.sin_family = AF_INET;
	if (bind(sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
		fprintf(stderr, "bind() failed: %s\n", strerror(errno));
		close(sock);
		return 1;
	}

	/* connect */
	if (connect(sock, ai->ai_addr, ai->ai_addrlen) == -1) {
		fprintf(stderr, "connect() failed: %s\n", strerror(errno));
		close(sock);
		return 1;
	}

	/* free address lookup info */
	freeaddrinfo(ai);

	/* get current terminal settings, set raw mode, make sure we
	 * register atexit handler to restore terminal settings
	 */
	tcgetattr(STDOUT_FILENO, &orig_tios);
	atexit(_cleanup);
	tios = orig_tios;
	cfmakeraw(&tios);
	tcsetattr(STDOUT_FILENO, TCSADRAIN, &tios);

	/* set input echoing on by default */
	do_echo = 1;

	/* initialize telnet box */
	telnet = telnet_init(telopts, _event_handler, 0, &sock);

	/* initialize poll descriptors */
	memset(pfd, 0, sizeof(pfd));
	pfd[0].fd = STDIN_FILENO;
	pfd[0].events = POLLIN;
	pfd[1].fd = sock;
	pfd[1].events = POLLIN;

	/* loop while both connections are open */
	while (poll(pfd, 2, -1) != -1) {
		/* read from stdin */
		if (pfd[0].revents & (POLLIN | POLLERR | POLLHUP)) {
			if ((rs = read(STDIN_FILENO, buffer, sizeof(buffer))) > 0) {
				_input(buffer, rs);
			} else if (rs == 0) {
				break;
			} else {
				fprintf(stderr, "recv(server) failed: %s\n",
						strerror(errno));
				exit(1);
			}
		}

		/* read from client */
		if (pfd[1].revents & (POLLIN | POLLERR | POLLHUP)) {
			if ((rs = recv(sock, buffer, sizeof(buffer), 0)) > 0) {
				telnet_recv(telnet, buffer, rs);
			} else if (rs == 0) {
				break;
			} else {
				fprintf(stderr, "recv(client) failed: %s\n",
						strerror(errno));
				exit(1);
			}
		}
	}

	/* clean up */
	telnet_free(telnet);
	close(sock);

	return 0;
}